

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<void_(const_char_*)>::~TypedExpectation
          (TypedExpectation<void_(const_char_*)> *this)

{
  linked_ptr<testing::ActionInterface<void_(const_char_*)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002f60f0;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<void_(const_char_*)>_> *)*ppvVar1;
    if (this_00 != (linked_ptr<testing::ActionInterface<void_(const_char_*)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<void_(const_char_*)>_>::~linked_ptr(this_00);
      operator_delete(this_00,0x10);
    }
  }
  linked_ptr<testing::ActionInterface<void_(const_char_*)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<const_char_*>_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3328;
  linked_ptr<const_testing::MatcherInterface<const_std::tuple<const_char_*>_&>_>::~linked_ptr
            (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<const_char_*>_&>.impl_);
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_char_*>_>.
  super__Head_base<0UL,_testing::Matcher<const_char_*>,_false>._M_head_impl.
  super_MatcherBase<const_char_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f3308;
  linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&(this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<const_char_*>_>.
              super__Head_base<0UL,_testing::Matcher<const_char_*>,_false>._M_head_impl.
              super_MatcherBase<const_char_*>.impl_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }